

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O3

collision_shape_ptr __thiscall
APhyBullet::BulletEngine::createCylinderY
          (BulletEngine *this,aphy_scalar half_width,aphy_scalar half_height,aphy_scalar half_depth)

{
  btCollisionShape *handle;
  BulletCollisionShape *this_00;
  collision_shape_ptr prVar1;
  btVector3 local_28;
  
  handle = (btCollisionShape *)btAlignedAllocInternal(0x48,0x10);
  local_28.m_floats[3] = 0.0;
  local_28.m_floats[0] = half_width;
  local_28.m_floats[1] = half_height;
  local_28.m_floats[2] = half_depth;
  btCylinderShape::btCylinderShape((btCylinderShape *)handle,&local_28);
  this_00 = (BulletCollisionShape *)operator_new(0x20);
  BulletCollisionShape::BulletCollisionShape(this_00,handle,Generic);
  prVar1 = (collision_shape_ptr)operator_new(0x18);
  prVar1->dispatchTable = (aphy_icd_dispatch *)aphy::cppRefcountedDispatchTable;
  prVar1->object = (collision_shape *)this_00;
  prVar1->strongCount = (__atomic_base<unsigned_int>)0x1;
  prVar1->weakCount = (__atomic_base<unsigned_int>)0x0;
  (this_00->super_collision_shape).super_base_interface.myRefCounter = prVar1;
  return prVar1;
}

Assistant:

collision_shape_ptr BulletEngine::createCylinderY(aphy_scalar half_width, aphy_scalar half_height, aphy_scalar half_depth)
{
    return makeObject<BulletCollisionShape> (
        new btCylinderShape(btVector3(half_width, half_height, half_depth))
    ).disown();
}